

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_p.h
# Opt level: O2

uint qt_gradient_clamp(QGradientData *data,int ipos)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = ipos;
  if (0x3ff < (uint)ipos) {
    if (data->spread == ReflectSpread) {
      uVar1 = ipos & 0x7ff;
      if (0x3ff < uVar1) {
        uVar1 = uVar1 ^ 0x7ff;
      }
      return uVar1;
    }
    if (data->spread == RepeatSpread) {
      return ipos & 0x3ff;
    }
    uVar2 = 0x3ff;
    if (ipos < 0) {
      uVar2 = 0;
    }
  }
  return uVar2;
}

Assistant:

static inline uint qt_gradient_clamp(const QGradientData *data, int ipos)
{
    if (ipos < 0 || ipos >= GRADIENT_STOPTABLE_SIZE) {
        if (data->spread == QGradient::RepeatSpread) {
            ipos = ipos % GRADIENT_STOPTABLE_SIZE;
            ipos = ipos < 0 ? GRADIENT_STOPTABLE_SIZE + ipos : ipos;
        } else if (data->spread == QGradient::ReflectSpread) {
            const int limit = GRADIENT_STOPTABLE_SIZE * 2;
            ipos = ipos % limit;
            ipos = ipos < 0 ? limit + ipos : ipos;
            ipos = ipos >= GRADIENT_STOPTABLE_SIZE ? limit - 1 - ipos : ipos;
        } else {
            if (ipos < 0)
                ipos = 0;
            else if (ipos >= GRADIENT_STOPTABLE_SIZE)
                ipos = GRADIENT_STOPTABLE_SIZE-1;
        }
    }

    Q_ASSERT(ipos >= 0);
    Q_ASSERT(ipos < GRADIENT_STOPTABLE_SIZE);

    return ipos;
}